

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O0

bool __thiscall ON_PlaneSurface::Extend(ON_PlaneSurface *this,int dir,ON_Interval *domain)

{
  bool bVar1;
  bool bVar2;
  double *pdVar3;
  double extraout_XMM0_Qa;
  double dVar4;
  double dVar5;
  double in_XMM1_Qa;
  ON_Interval local_70;
  ON_Interval local_60;
  undefined1 local_50 [8];
  ON_Interval xdom;
  ON_Interval tdom;
  bool changed;
  ON_Interval *domain_local;
  int dir_local;
  ON_PlaneSurface *this_local;
  
  if ((dir < 0) || (1 < dir)) {
    this_local._7_1_ = false;
  }
  else {
    (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])();
    local_50 = *(undefined1 (*) [8])(&this->field_0xb0 + (long)dir * 0x10);
    xdom.m_t[0] = *(double *)((long)(&this->field_0xb0 + (long)dir * 0x10) + 8);
    xdom.m_t[1] = extraout_XMM0_Qa;
    dVar4 = ON_Interval::operator[](domain,0);
    (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])();
    pdVar3 = ON_Interval::operator[](&local_60,0);
    bVar1 = dVar4 < *pdVar3;
    if (bVar1) {
      dVar5 = ON_Interval::operator[](domain,0);
      pdVar3 = ON_Interval::operator[]((ON_Interval *)(xdom.m_t + 1),0);
      *pdVar3 = dVar5;
      dVar5 = ON_Interval::operator[](domain,0);
      dVar5 = ON_Interval::NormalizedParameterAt
                        ((ON_Interval *)(&this->field_0x90 + (long)dir * 0x10),dVar5);
      dVar5 = ON_Interval::ParameterAt((ON_Interval *)(&this->field_0xb0 + (long)dir * 0x10),dVar5);
      pdVar3 = ON_Interval::operator[]((ON_Interval *)local_50,0);
      *pdVar3 = dVar5;
    }
    dVar5 = ON_Interval::operator[](domain,1);
    (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])
              (this,(ulong)(uint)dir);
    local_70.m_t[1] = dVar4;
    pdVar3 = ON_Interval::operator[](&local_70,1);
    bVar2 = *pdVar3 <= dVar5 && dVar5 != *pdVar3;
    if (bVar2) {
      dVar4 = ON_Interval::operator[](domain,1);
      pdVar3 = ON_Interval::operator[]((ON_Interval *)(xdom.m_t + 1),1);
      *pdVar3 = dVar4;
      dVar4 = ON_Interval::operator[](domain,1);
      dVar4 = ON_Interval::NormalizedParameterAt
                        ((ON_Interval *)(&this->field_0x90 + (long)dir * 0x10),dVar4);
      dVar4 = ON_Interval::ParameterAt((ON_Interval *)(&this->field_0xb0 + (long)dir * 0x10),dVar4);
      pdVar3 = ON_Interval::operator[]((ON_Interval *)local_50,1);
      *pdVar3 = dVar4;
    }
    tdom.m_t[1]._7_1_ = bVar2 || bVar1;
    if (tdom.m_t[1]._7_1_) {
      ON_Surface::DestroySurfaceTree(&this->super_ON_Surface);
      *(double *)(&this->field_0x90 + (long)dir * 0x10) = xdom.m_t[1];
      *(double *)((long)(&this->field_0x90 + (long)dir * 0x10) + 8) = in_XMM1_Qa;
      *(undefined1 (*) [8])(&this->field_0xb0 + (long)dir * 0x10) = local_50;
      *(double *)((long)(&this->field_0xb0 + (long)dir * 0x10) + 8) = xdom.m_t[0];
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_PlaneSurface::Extend(
      int dir,
      const ON_Interval& domain
      )
{
  if ( dir < 0 || dir > 1 ) return false;
  bool changed = false;
  ON_Interval tdom = Domain(dir);
  ON_Interval xdom = m_extents[dir];

  if (domain[0] < Domain(dir)[0]){
    changed = true;
    tdom[0] = domain[0];
    xdom[0] = m_extents[dir].ParameterAt( m_domain[dir].NormalizedParameterAt(domain[0]));
  }
  if (domain[1] > Domain(dir)[1]){
    changed = true;
    tdom[1] = domain[1];
    xdom[1] = m_extents[dir].ParameterAt( m_domain[dir].NormalizedParameterAt(domain[1]));
  }
  if (!changed) return false;
  DestroySurfaceTree();

  m_domain[dir] = tdom;
  m_extents[dir] = xdom;
  return true;
}